

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O1

void __thiscall
QAbstractSocketPrivate::startConnectingByName(QAbstractSocketPrivate *this,QString *host)

{
  QObject *pQVar1;
  bool bVar2;
  char cVar3;
  SocketState SVar4;
  SocketError SVar5;
  long in_FS_OFFSET;
  SocketState local_5c;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->state & ~HostLookupState) == ConnectingState) goto LAB_001c1473;
  pQVar1 = *(QObject **)&this->field_0x8;
  this->state = ConnectingState;
  local_5c = ConnectingState;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)&local_5c;
  QMetaObject::activate(pQVar1,&QAbstractSocket::staticMetaObject,3,(void **)&local_58);
  if (this->cachedSocketDescriptor == -1) {
    bVar2 = initSocketLayer(this,UnknownNetworkLayerProtocol);
    if (bVar2) goto LAB_001c1363;
  }
  else {
LAB_001c1363:
    cVar3 = (**(code **)(*(long *)this->socketEngine + 0x88))(this->socketEngine,host,this->port);
    if (cVar3 != '\0') {
      fetchConnectionParameters(this);
      goto LAB_001c1473;
    }
    SVar4 = QAbstractSocketEngine::state((QAbstractSocketEngine *)this->socketEngine);
    if (SVar4 == ConnectingState) goto LAB_001c1473;
    SVar5 = QAbstractSocketEngine::error((QAbstractSocketEngine *)this->socketEngine);
    QAbstractSocketEngine::errorString(&local_58,(QAbstractSocketEngine *)this->socketEngine);
    this->socketError = SVar5;
    QString::operator=((QString *)&this->field_0x168,(QString *)&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  this->state = UnconnectedState;
  local_5c = this->socketError;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)&local_5c;
  QMetaObject::activate(pQVar1,&QAbstractSocket::staticMetaObject,4,(void **)&local_58);
  local_5c = this->state;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)&local_5c;
  QMetaObject::activate(pQVar1,&QAbstractSocket::staticMetaObject,3,(void **)&local_58);
LAB_001c1473:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSocketPrivate::startConnectingByName(const QString &host)
{
    Q_Q(QAbstractSocket);
    if (state == QAbstractSocket::ConnectingState || state == QAbstractSocket::ConnectedState)
        return;

#if defined(QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::startConnectingByName(host == %s)", qPrintable(host));
#endif

    // ### Let the socket engine drive this?
    state = QAbstractSocket::ConnectingState;
    emit q->stateChanged(state);

    if (cachedSocketDescriptor != -1 || initSocketLayer(QAbstractSocket::UnknownNetworkLayerProtocol)) {
        // Try to connect to the host. If it succeeds immediately
        // (e.g. QSocks5SocketEngine in UDPASSOCIATE mode), emit
        // connected() and return.
        if (socketEngine->connectToHostByName(host, port)) {
            fetchConnectionParameters();
            return;
        }

        if (socketEngine->state() == QAbstractSocket::ConnectingState)
            return;

        // failed to connect
        setError(socketEngine->error(), socketEngine->errorString());
    }

    state = QAbstractSocket::UnconnectedState;
    emit q->errorOccurred(socketError);
    emit q->stateChanged(state);
}